

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_missingUnitsFromImportOfCnTerms_Test::~Importer_missingUnitsFromImportOfCnTerms_Test
          (Importer_missingUnitsFromImportOfCnTerms_Test *this)

{
  Importer_missingUnitsFromImportOfCnTerms_Test *this_local;
  
  ~Importer_missingUnitsFromImportOfCnTerms_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, missingUnitsFromImportOfCnTerms)
{
    // This test is intended to show that parsing a model and importing
    // it have the same end result.
    auto validator = libcellml::Validator::create();
    auto model = libcellml::Model::create("model_from_imports");
    auto c = libcellml::Component::create("c");
    auto importer = libcellml::Importer::create();

    auto imp = libcellml::ImportSource::create();
    imp->setUrl("units_in_cn.cellml");

    c->setImportReference("myComponent");
    c->setImportSource(imp);
    model->addComponent(c);

    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath());
    EXPECT_FALSE(model->hasUnresolvedImports());
    model = importer->flattenModel(model);

    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->errorCount());
}